

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

void luaC_freeallobjects(lua_State *L)

{
  global_State *L_00;
  long lVar1;
  long lVar2;
  
  L_00 = L->l_G;
  separatetobefnz((lua_State *)L_00,1);
  callallpendingfinalizers(L,0);
  L_00->currentwhite = '\x03';
  L_00->gckind = '\0';
  sweeplist(L,&L_00->finobj,0xfffffffffffffffd);
  sweeplist(L,&L_00->allgc,0xfffffffffffffffd);
  if (0 < (L_00->strt).size) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      sweeplist(L,(GCObject **)((long)&((StkId)(L_00->strt).hash)->value_ + lVar2),
                0xfffffffffffffffd);
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar1 < (L_00->strt).size);
  }
  return;
}

Assistant:

void luaC_freeallobjects (lua_State *L) {
  global_State *g = G(L);
  int i;
  separatetobefnz(L, 1);  /* separate all objects with finalizers */
  lua_assert(g->finobj == NULL);
  callallpendingfinalizers(L, 0);
  g->currentwhite = WHITEBITS; /* this "white" makes all objects look dead */
  g->gckind = KGC_NORMAL;
  sweepwholelist(L, &g->finobj);  /* finalizers can create objs. in 'finobj' */
  sweepwholelist(L, &g->allgc);
  for (i = 0; i < g->strt.size; i++)  /* free all string lists */
    sweepwholelist(L, &g->strt.hash[i]);
  lua_assert(g->strt.nuse == 0);
}